

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

IvVec2 * __thiscall
deqp::egl::UpdateResolutionCase::getNativePixelsPerInch
          (IvVec2 *__return_storage_ptr__,UpdateResolutionCase *this)

{
  eglu *this_00;
  EGLDisplay pvVar1;
  double dVar2;
  double dVar3;
  Interval x_;
  Interval s;
  Interval y_;
  int iVar4;
  Library *egl_00;
  UniqueSurface *pUVar5;
  EGLSurface pvVar6;
  NativeWindow *pNVar7;
  MessageBuilder *pMVar8;
  MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *this_01;
  bool local_469;
  allocator<char> local_361;
  string local_360;
  MessageBuilder local_330;
  Interval local_1b0;
  Interval local_198;
  Vector<int,_2> local_180;
  IVec2 winPpi;
  IvVec2 local_148;
  Vector<tcu::Interval,_2> local_118;
  Interval local_e8;
  Interval local_d0;
  Interval local_b8;
  Vector<tcu::Interval,_2> local_a0;
  undefined1 local_70 [8];
  IvVec2 bufPpiI;
  IVec2 bufPp10km;
  IVec2 winSize;
  IVec2 bufSize;
  int inchPer10km;
  Library *egl;
  UpdateResolutionCase *this_local;
  IvVec2 *winPpiI;
  
  egl_00 = EglTestContext::getLibrary((this->super_ResizeTest).super_TestCase.m_eglTestCtx);
  pvVar1 = (this->super_ResizeTest).m_display;
  this_01 = &(this->super_ResizeTest).m_surface;
  pUVar5 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&this_01->
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar6 = eglu::UniqueSurface::operator*(pUVar5);
  eglu::getSurfaceSize((eglu *)&winSize,egl_00,pvVar1,pvVar6);
  pNVar7 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
           operator->(&(this->super_ResizeTest).m_nativeWindow.
                       super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>
                     );
  (*pNVar7->_vptr_NativeWindow[7])();
  pvVar1 = (this->super_ResizeTest).m_display;
  pUVar5 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&this_01->
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar6 = eglu::UniqueSurface::operator*(pUVar5);
  this_00 = (eglu *)((long)&bufPpiI.m_data[1].m_hi + 4);
  eglu::getSurfaceResolution(this_00,egl_00,pvVar1,pvVar6);
  iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)this_00);
  approximateInt(&local_b8,iVar4);
  iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)this_00);
  approximateInt(&local_d0,iVar4);
  x_.m_lo = local_b8.m_lo;
  x_.m_hasNaN = local_b8.m_hasNaN;
  x_._1_7_ = local_b8._1_7_;
  x_.m_hi = local_b8.m_hi;
  y_.m_lo = local_d0.m_lo;
  y_.m_hasNaN = local_d0.m_hasNaN;
  y_._1_7_ = local_d0._1_7_;
  y_.m_hi = local_d0.m_hi;
  tcu::Vector<tcu::Interval,_2>::Vector(&local_a0,x_,y_);
  tcu::Interval::Interval(&local_e8,2540000.0);
  s.m_lo = local_e8.m_lo;
  s.m_hasNaN = local_e8.m_hasNaN;
  s._1_7_ = local_e8._1_7_;
  s.m_hi = local_e8.m_hi;
  tcu::operator/((Vector<tcu::Interval,_2> *)local_70,&local_a0,s);
  ivVec2(&local_148,&bufPp10km);
  tcu::operator*(&local_118,&local_148,(Vector<tcu::Interval,_2> *)local_70);
  ivVec2((IvVec2 *)&winPpi,&winSize);
  tcu::operator/(__return_storage_ptr__,&local_118,(IvVec2 *)&winPpi);
  tcu::Vector<tcu::Interval,_2>::x(&local_198,__return_storage_ptr__);
  dVar2 = tcu::Interval::midpoint(&local_198);
  tcu::Vector<tcu::Interval,_2>::y(&local_1b0,__return_storage_ptr__);
  dVar3 = tcu::Interval::midpoint(&local_1b0);
  tcu::Vector<int,_2>::Vector(&local_180,(int)dVar2,(int)dVar3);
  tcu::TestLog::operator<<
            (&local_330,(this->super_ResizeTest).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_330,(char (*) [19])"EGL surface size: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&winSize);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b8f97b);
  pMVar8 = tcu::MessageBuilder::operator<<
                     (pMVar8,(char (*) [45])"EGL surface pixel density (pixels / 10 km): ");
  pMVar8 = tcu::MessageBuilder::operator<<
                     (pMVar8,(Vector<int,_2> *)((long)&bufPpiI.m_data[1].m_hi + 4));
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b8f97b);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])"Native window size: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&bufPp10km);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b8f97b);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [29])"Native pixel density (ppi): ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_180);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b8f97b);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_330);
  iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)((long)&bufPpiI.m_data[1].m_hi + 4));
  local_469 = false;
  if (0 < iVar4) {
    iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)((long)&bufPpiI.m_data[1].m_hi + 4));
    local_469 = 0 < iVar4;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,
             "Surface pixel density is less than one pixel per 10 km. Is the surface really visible from space?"
             ,&local_361);
  tcu::ResultCollector::checkResult
            (&(this->super_ResizeTest).m_status,local_469,QP_TEST_RESULT_QUALITY_WARNING,&local_360)
  ;
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  return __return_storage_ptr__;
}

Assistant:

IvVec2 UpdateResolutionCase::getNativePixelsPerInch	(void)
{
	const Library&	egl			= m_eglTestCtx.getLibrary();
	const int		inchPer10km	= 254 * EGL_DISPLAY_SCALING;
	const IVec2		bufSize		= eglu::getSurfaceSize(egl, m_display, **m_surface);
	const IVec2		winSize		= m_nativeWindow->getScreenSize();
	const IVec2		bufPp10km	= eglu::getSurfaceResolution(egl, m_display, **m_surface);
	const IvVec2	bufPpiI		= (IvVec2(approximateInt(bufPp10km.x()),
										  approximateInt(bufPp10km.y()))
								   / Interval(inchPer10km));
	const IvVec2	winPpiI		= ivVec2(winSize) * bufPpiI / ivVec2(bufSize);
	const IVec2		winPpi		(int(winPpiI.x().midpoint()), int(winPpiI.y().midpoint()));

	m_log << TestLog::Message
		  << "EGL surface size: "							<< bufSize		<< "\n"
		  << "EGL surface pixel density (pixels / 10 km): "	<< bufPp10km	<< "\n"
		  << "Native window size: "							<< winSize		<< "\n"
		  << "Native pixel density (ppi): "					<< winPpi		<< "\n"
		  << TestLog::EndMessage;

	m_status.checkResult(bufPp10km.x() >= 1 && bufPp10km.y() >= 1,
						 QP_TEST_RESULT_QUALITY_WARNING,
						 "Surface pixel density is less than one pixel per 10 km. "
						 "Is the surface really visible from space?");

	return winPpiI;
}